

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O0

int mbedtls_rsa_public(mbedtls_rsa_context *ctx,uchar *input,uchar *output)

{
  int iVar1;
  long in_RDI;
  mbedtls_mpi T;
  size_t olen;
  int ret;
  mbedtls_mpi *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  mbedtls_rsa_context *in_stack_ffffffffffffffc8;
  mbedtls_mpi *in_stack_ffffffffffffffd0;
  int local_24;
  int local_4;
  
  iVar1 = rsa_check_context(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                            in_stack_ffffffffffffffc0);
  if (iVar1 == 0) {
    mbedtls_mpi_init((mbedtls_mpi *)&stack0xffffffffffffffc0);
    local_24 = mbedtls_mpi_read_binary
                         (in_stack_ffffffffffffffd0,(uchar *)in_stack_ffffffffffffffc8,
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (local_24 == 0) {
      iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&stack0xffffffffffffffc0,
                                  (mbedtls_mpi *)(in_RDI + 0x10));
      if (iVar1 < 0) {
        local_24 = mbedtls_mpi_exp_mod_unsafe
                             (*(mbedtls_mpi **)(in_RDI + 8),(mbedtls_mpi *)in_stack_ffffffffffffffc8
                              ,(mbedtls_mpi *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffb8,(mbedtls_mpi *)0x867288);
        if (local_24 == 0) {
          local_24 = mbedtls_mpi_write_binary
                               ((mbedtls_mpi *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                (uchar *)in_stack_ffffffffffffffb8,0x8672ab);
        }
      }
      else {
        local_24 = -4;
      }
    }
    mbedtls_mpi_free((mbedtls_mpi *)0x8672c4);
    if (local_24 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = mbedtls_error_add(-0x4280,local_24,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/third_party/mbedtls/library/rsa.cpp"
                                  ,0x4fc);
    }
  }
  else {
    local_4 = -0x4080;
  }
  return local_4;
}

Assistant:

int mbedtls_rsa_public(mbedtls_rsa_context *ctx,
                       const unsigned char *input,
                       unsigned char *output)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t olen;
    mbedtls_mpi T;

    if (rsa_check_context(ctx, 0 /* public */, 0 /* no blinding */)) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    mbedtls_mpi_init(&T);

#if defined(MBEDTLS_THREADING_C)
    if ((ret = mbedtls_mutex_lock(&ctx->mutex)) != 0) {
        return ret;
    }
#endif

    MBEDTLS_MPI_CHK(mbedtls_mpi_read_binary(&T, input, ctx->len));

    if (mbedtls_mpi_cmp_mpi(&T, &ctx->N) >= 0) {
        ret = MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
        goto cleanup;
    }

    olen = ctx->len;
    MBEDTLS_MPI_CHK(mbedtls_mpi_exp_mod_unsafe(&T, &T, &ctx->E, &ctx->N, &ctx->RN));
    MBEDTLS_MPI_CHK(mbedtls_mpi_write_binary(&T, output, olen));

cleanup:
#if defined(MBEDTLS_THREADING_C)
    if (mbedtls_mutex_unlock(&ctx->mutex) != 0) {
        return MBEDTLS_ERR_THREADING_MUTEX_ERROR;
    }
#endif

    mbedtls_mpi_free(&T);

    if (ret != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_RSA_PUBLIC_FAILED, ret);
    }

    return 0;
}